

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>_>
* __thiscall
diligent_spirv_cross::Compiler::get_active_interface_variables
          (unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>_>
           *__return_storage_ptr__,Compiler *this)

{
  uint32_t id;
  SPIRFunction *func;
  TypedID<(diligent_spirv_cross::Types)2> local_5c;
  anon_class_16_2_608111e4 local_58 [2];
  undefined1 local_38 [8];
  InterfaceVariableAccessHandler handler;
  Compiler *this_local;
  unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>_>
  *variables;
  
  handler.variables._7_1_ = 0;
  ::std::
  unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>_>
  ::unordered_set(__return_storage_ptr__);
  InterfaceVariableAccessHandler::InterfaceVariableAccessHandler
            ((InterfaceVariableAccessHandler *)local_38,this,__return_storage_ptr__);
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(this->ir).default_entry_point);
  func = get<diligent_spirv_cross::SPIRFunction>(this,id);
  traverse_all_reachable_opcodes(this,func,(OpcodeHandler *)local_38);
  local_58[0].this = this;
  local_58[0].variables = __return_storage_ptr__;
  ParsedIR::
  for_each_typed_id<diligent_spirv_cross::SPIRVariable,diligent_spirv_cross::Compiler::get_active_interface_variables()const::__0>
            (&this->ir,local_58);
  if (this->dummy_sampler_id != 0) {
    TypedID<(diligent_spirv_cross::Types)2>::TypedID(&local_5c,this->dummy_sampler_id);
    ::std::
    unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>_>
    ::insert(__return_storage_ptr__,&local_5c);
  }
  handler.variables._7_1_ = 1;
  InterfaceVariableAccessHandler::~InterfaceVariableAccessHandler
            ((InterfaceVariableAccessHandler *)local_38);
  if ((handler.variables._7_1_ & 1) == 0) {
    ::std::
    unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>_>
    ::~unordered_set(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

unordered_set<VariableID> Compiler::get_active_interface_variables() const
{
	// Traverse the call graph and find all interface variables which are in use.
	unordered_set<VariableID> variables;
	InterfaceVariableAccessHandler handler(*this, variables);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		if (var.storage != StorageClassOutput)
			return;
		if (!interface_variable_exists_in_entry_point(var.self))
			return;

		// An output variable which is just declared (but uninitialized) might be read by subsequent stages
		// so we should force-enable these outputs,
		// since compilation will fail if a subsequent stage attempts to read from the variable in question.
		// Also, make sure we preserve output variables which are only initialized, but never accessed by any code.
		if (var.initializer != ID(0) || get_execution_model() != ExecutionModelFragment)
			variables.insert(var.self);
	});

	// If we needed to create one, we'll need it.
	if (dummy_sampler_id)
		variables.insert(dummy_sampler_id);

	return variables;
}